

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

NotificationHandle * __thiscall
jsonrpccxx::notificationHandle<SomeClass,std::__cxx11::string_const&>
          (NotificationHandle *__return_storage_ptr__,jsonrpccxx *this,
          offset_in_SomeClass_to_subr method,SomeClass *instance)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *method_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  function;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fStack_68;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_48;
  anon_class_24_2_b747b145 local_28;
  
  local_28.instance = instance;
  local_28.method = (offset_in_SomeClass_to_subr)this;
  local_28._16_8_ = method;
  std::function<void(std::__cxx11::string_const&)>::
  function<jsonrpccxx::notificationHandle<SomeClass,std::__cxx11::string_const&>(void(SomeClass::*)(std::__cxx11::string_const&),SomeClass&)::_lambda(std::__cxx11::string_const&)_1_,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_48,&local_28);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&fStack_68,&local_48);
  notificationHandle<std::__cxx11::string_const&>
            (__return_storage_ptr__,(jsonrpccxx *)&fStack_68,method_00);
  std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

NotificationHandle notificationHandle(void (T::*method)(ParamTypes...), T &instance) {
    std::function<void(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> void {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return notificationHandle(function);
  }